

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_decoder.h
# Opt level: O2

void __thiscall draco::MeshEdgebreakerTraversalDecoder::Done(MeshEdgebreakerTraversalDecoder *this)

{
  if ((this->symbol_buffer_).bit_mode_ == true) {
    DecoderBuffer::EndBitDecoding(&this->symbol_buffer_);
  }
  if ((this->buffer_).bitstream_version_ < 0x202) {
    DecoderBuffer::EndBitDecoding(&this->start_face_buffer_);
    return;
  }
  return;
}

Assistant:

void Done() {
    if (symbol_buffer_.bit_decoder_active()) {
      symbol_buffer_.EndBitDecoding();
    }
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (buffer_.bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
      start_face_buffer_.EndBitDecoding();

    } else
#endif
    {
      start_face_decoder_.EndDecoding();
    }
  }